

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

void DrawTriangleFan(Vector2 *points,int pointsCount,Color color)

{
  ulong uVar1;
  ulong uVar2;
  
  if (2 < pointsCount) {
    rlCheckRenderBatchLimit(pointsCount * 4 + -8);
    rlSetTexture(texShapes.id);
    rlBegin(7);
    rlColor4ub(color.r,color.g,color.b,color.a);
    uVar2 = 1;
    do {
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(points->x,points->y);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(points[uVar2].x,points[uVar2].y);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      uVar1 = uVar2 + 1;
      rlVertex2f(points[uVar2 + 1].x,points[uVar2 + 1].y);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(points[uVar2 + 1].x,points[uVar2 + 1].y);
      uVar2 = uVar1;
    } while (pointsCount - 1 != uVar1);
    rlEnd();
    rlSetTexture(0);
    return;
  }
  return;
}

Assistant:

void DrawTriangleFan(Vector2 *points, int pointsCount, Color color)
{
    if (pointsCount >= 3)
    {
        rlCheckRenderBatchLimit((pointsCount - 2)*4);

        rlSetTexture(texShapes.id);
        rlBegin(RL_QUADS);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 1; i < pointsCount - 1; i++)
            {
                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(points[0].x, points[0].y);

                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(points[i].x, points[i].y);

                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);

                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);
            }
        rlEnd();
        rlSetTexture(0);
    }
}